

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void share_disconnect(ssh_sharing_connstate *cs,char *message)

{
  strbuf *buf_o;
  strbuf *packet;
  char *message_local;
  ssh_sharing_connstate *cs_local;
  
  buf_o = strbuf_new();
  BinarySink_put_uint32(buf_o->binarysink_,2);
  BinarySink_put_stringz(buf_o->binarysink_,message);
  BinarySink_put_stringz(buf_o->binarysink_,"en");
  send_packet_to_downstream(cs,1,buf_o->s,(int)buf_o->len,(share_channel *)0x0);
  strbuf_free(buf_o);
  share_begin_cleanup(cs);
  return;
}

Assistant:

static void share_disconnect(struct ssh_sharing_connstate *cs,
                             const char *message)
{
    strbuf *packet = strbuf_new();
    put_uint32(packet, SSH2_DISCONNECT_PROTOCOL_ERROR);
    put_stringz(packet, message);
    put_stringz(packet, "en");         /* language */
    send_packet_to_downstream(cs, SSH2_MSG_DISCONNECT,
                              packet->s, packet->len, NULL);
    strbuf_free(packet);

    share_begin_cleanup(cs);
}